

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::PrepareForNewNode(XMLPrinter *this,bool compactMode)

{
  bool compactMode_local;
  XMLPrinter *this_local;
  
  SealElementIfJustOpened(this);
  if (!compactMode) {
    if ((this->_firstElement & 1U) == 0) {
      if (this->_textDepth < 0) {
        (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xf])(this,10);
        (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xc])(this,(ulong)(uint)this->_depth);
      }
    }
    else {
      (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xc])(this,(ulong)(uint)this->_depth);
    }
    this->_firstElement = false;
  }
  return;
}

Assistant:

void XMLPrinter::PrepareForNewNode( bool compactMode )
{
    SealElementIfJustOpened();

    if ( compactMode ) {
        return;
    }

    if ( _firstElement ) {
        PrintSpace (_depth);
    } else if ( _textDepth < 0) {
        Putc( '\n' );
        PrintSpace( _depth );
    }

    _firstElement = false;
}